

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRError.h
# Opt level: O0

void __thiscall MinVR::VRError::~VRError(VRError *this)

{
  exception *in_RDI;
  
  *(undefined ***)in_RDI = &PTR__VRError_001793a0;
  std::__cxx11::string::~string((string *)(in_RDI + 0x88));
  std::__cxx11::string::~string((string *)(in_RDI + 0x68));
  std::__cxx11::string::~string((string *)(in_RDI + 0x48));
  std::__cxx11::string::~string((string *)(in_RDI + 0x28));
  std::__cxx11::string::~string((string *)(in_RDI + 8));
  std::exception::~exception(in_RDI);
  return;
}

Assistant:

virtual ~VRError() throw (){}